

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uiter.cpp
# Opt level: O0

UChar32 utf8IteratorCurrent(UCharIterator *iter)

{
  int iVar1;
  void *pvVar2;
  byte bVar3;
  int iVar4;
  byte local_29;
  int local_28;
  uint uStack_24;
  uint8_t __t;
  int32_t i;
  UChar32 c;
  uint8_t *s;
  UCharIterator *iter_local;
  
  if (iter->reservedField != 0) {
    return iter->reservedField & 0x3ffU | 0xdc00;
  }
  if (iter->limit <= iter->start) {
    return -1;
  }
  pvVar2 = iter->context;
  iVar1 = iter->start;
  local_28 = iVar1 + 1;
  uStack_24 = (uint)*(byte *)((long)pvVar2 + (long)iVar1);
  if ((*(byte *)((long)pvVar2 + (long)iVar1) & 0x80) == 0) goto LAB_0037b088;
  if (local_28 != iter->limit) {
    if (uStack_24 < 0xe0) {
      if (0xc1 < uStack_24) {
        uStack_24 = uStack_24 & 0x1f;
LAB_0037b041:
        bVar3 = *(char *)((long)pvVar2 + (long)local_28) + 0x80;
        if (bVar3 < 0x40) {
          uStack_24 = uStack_24 << 6 | (uint)bVar3;
          goto LAB_0037b088;
        }
      }
    }
    else if (uStack_24 < 0xf0) {
      uStack_24 = uStack_24 & 0xf;
      if (((int)" 000000000000\x1000"[(int)uStack_24] &
          1 << (sbyte)((int)(uint)*(byte *)((long)pvVar2 + (long)local_28) >> 5)) != 0) {
        local_29 = *(byte *)((long)pvVar2 + (long)local_28) & 0x3f;
LAB_0037b004:
        uStack_24 = uStack_24 << 6 | (uint)local_29;
        local_28 = local_28 + 1;
        if (local_28 != iter->limit) goto LAB_0037b041;
      }
    }
    else {
      iVar4 = uStack_24 - 0xf0;
      if ((iVar4 < 5) &&
         (((int)""[(int)(uint)*(byte *)((long)pvVar2 + (long)local_28) >> 4] &
          1 << ((byte)iVar4 & 0x1f)) != 0)) {
        uStack_24 = iVar4 * 0x40 | *(byte *)((long)pvVar2 + (long)local_28) & 0x3f;
        local_28 = iVar1 + 2;
        if ((local_28 != iter->limit) &&
           (local_29 = *(char *)((long)pvVar2 + (long)local_28) + 0x80, local_29 < 0x40))
        goto LAB_0037b004;
      }
    }
  }
  uStack_24 = 0xfffd;
LAB_0037b088:
  if ((int)uStack_24 < 0x10000) {
    iter_local._4_4_ = uStack_24;
  }
  else {
    iter_local._4_4_ = ((int)uStack_24 >> 10) + 0xd7c0U & 0xffff;
  }
  return iter_local._4_4_;
}

Assistant:

static UChar32 U_CALLCONV
utf8IteratorCurrent(UCharIterator *iter) {
    if(iter->reservedField!=0) {
        return U16_TRAIL(iter->reservedField);
    } else if(iter->start<iter->limit) {
        const uint8_t *s=(const uint8_t *)iter->context;
        UChar32 c;
        int32_t i=iter->start;

        U8_NEXT_OR_FFFD(s, i, iter->limit, c);
        if(c<=0xffff) {
            return c;
        } else {
            return U16_LEAD(c);
        }
    } else {
        return U_SENTINEL;
    }
}